

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

bool __thiscall
cmCTest::RunCommand(cmCTest *this,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *args,string *stdOut,string *stdErr,int *retVal,char *dir,cmDuration timeout,
                   Encoding encoding)

{
  pointer __s;
  bool bVar1;
  uint uVar2;
  size_type sVar3;
  cmUVProcessChainBuilder *pcVar4;
  _func_void_uv_timer_t_ptr *cb;
  pointer pPVar5;
  ulong uVar6;
  uv_loop_t *puVar7;
  char *pcVar8;
  ostream *poVar9;
  rep_conflict rVar10;
  byte local_629;
  string local_5b0 [32];
  undefined1 local_590 [8];
  ostringstream cmCTestLog_msg_1;
  undefined1 local_418 [8];
  pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  exception;
  Status *status;
  undefined1 local_3c8 [8];
  ostringstream cmCTestLog_msg;
  char *error_str;
  undefined1 local_240 [7];
  bool result;
  vector<char,_std::allocator<char>_> local_228;
  string local_210;
  undefined1 local_1f0 [8];
  string strdata;
  unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_> errorHandle;
  unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_> outputHandle;
  anon_class_24_3_169f6e42 startRead;
  undefined1 local_1a0 [7];
  cmProcessOutput processOutput;
  uv_pipe_ptr errStream;
  undefined1 local_188 [7];
  bool errFinished;
  vector<char,_std::allocator<char>_> tempError;
  uv_pipe_ptr outStream;
  undefined1 local_158 [7];
  bool outFinished;
  vector<char,_std::allocator<char>_> tempOutput;
  undefined1 local_138 [7];
  bool timedOut;
  uv_timer_ptr timer;
  cmUVProcessChain chain;
  string local_118;
  undefined1 local_f8 [8];
  cmUVProcessChainBuilder builder;
  value_type local_90;
  reference local_88;
  string *a;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  undefined1 local_58 [8];
  vector<const_char_*,_std::allocator<const_char_*>_> argv;
  char *dir_local;
  int *retVal_local;
  string *stdErr_local;
  string *stdOut_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmCTest *this_local;
  cmDuration timeout_local;
  
  argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)dir;
  this_local = (cmCTest *)timeout.__r;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_58);
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::reserve
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_58,sVar3 + 1);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(args);
  a = (string *)
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end(args);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&a), bVar1) {
    local_88 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1);
    local_90 = (value_type)std::__cxx11::string::c_str();
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_58,&local_90);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  builder.Loop = (uv_loop_t *)0x0;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_58,
             (value_type *)&builder.Loop);
  std::__cxx11::string::clear();
  std::__cxx11::string::clear();
  cmUVProcessChainBuilder::cmUVProcessChainBuilder((cmUVProcessChainBuilder *)local_f8);
  pcVar4 = cmUVProcessChainBuilder::AddCommand((cmUVProcessChainBuilder *)local_f8,args);
  pcVar4 = cmUVProcessChainBuilder::SetBuiltinStream(pcVar4,Stream_OUTPUT);
  cmUVProcessChainBuilder::SetBuiltinStream(pcVar4,Stream_ERROR);
  __s = argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  if (argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,(char *)__s,
               (allocator<char> *)
               ((long)&chain.Data._M_t.
                       super___uniq_ptr_impl<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmUVProcessChain::InternalData_*,_std::default_delete<cmUVProcessChain::InternalData>_>
                       .super__Head_base<0UL,_cmUVProcessChain::InternalData_*,_false> + 7));
    cmUVProcessChainBuilder::SetWorkingDirectory((cmUVProcessChainBuilder *)local_f8,&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&chain.Data._M_t.
                       super___uniq_ptr_impl<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmUVProcessChain::InternalData_*,_std::default_delete<cmUVProcessChain::InternalData>_>
                       .super__Head_base<0UL,_cmUVProcessChain::InternalData_*,_false> + 7));
  }
  cmUVProcessChainBuilder::Start
            ((cmUVProcessChainBuilder *)
             &timer.super_uv_handle_ptr_<uv_timer_s>.super_uv_handle_ptr_base_<uv_timer_s>.handle.
              super___shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  ::cm::uv_timer_ptr::uv_timer_ptr((uv_timer_ptr *)local_138);
  tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_ = 0;
  rVar10 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count
                     ((duration<double,_std::ratio<1L,_1L>_> *)&this_local);
  if ((rVar10 != 0.0) || (NAN(rVar10))) {
    puVar7 = cmUVProcessChain::GetLoop
                       ((cmUVProcessChain *)
                        &timer.super_uv_handle_ptr_<uv_timer_s>.
                         super_uv_handle_ptr_base_<uv_timer_s>.handle.
                         super___shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    ::cm::uv_timer_ptr::init((uv_timer_ptr *)local_138,(EVP_PKEY_CTX *)puVar7);
    cb = RunCommand(std::vector_const&,std::__cxx11::string*,std::__cxx11::string*,int*,char_const*,std::chrono::duration,cmProcessOutput::Encoding)
         ::$_0::operator_cast_to_function_pointer
                   ((__0 *)&tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            field_0x16);
    rVar10 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count
                       ((duration<double,_std::ratio<1L,_1L>_> *)&this_local);
    uVar6 = (ulong)(rVar10 * 1000.0);
    ::cm::uv_timer_ptr::start
              ((uv_timer_ptr *)local_138,cb,
               uVar6 | (long)(rVar10 * 1000.0 - 9.223372036854776e+18) & (long)uVar6 >> 0x3f,0);
  }
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)local_158)
  ;
  ::cm::uv_pipe_ptr::uv_pipe_ptr
            ((uv_pipe_ptr *)
             &tempError.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)local_188)
  ;
  ::cm::uv_pipe_ptr::uv_pipe_ptr((uv_pipe_ptr *)local_1a0);
  cmProcessOutput::cmProcessOutput
            ((cmProcessOutput *)((long)&startRead.processOutput + 7),encoding,0x400);
  startRead.this =
       (cmCTest *)
       &timer.super_uv_handle_ptr_<uv_timer_s>.super_uv_handle_ptr_base_<uv_timer_s>.handle.
        super___shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  startRead.chain = (cmUVProcessChain *)((long)&startRead.processOutput + 7);
  outputHandle._M_t.
  super___uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>._M_t.
  super__Tuple_impl<0UL,_cmUVStreamReadHandle_*,_std::default_delete<cmUVStreamReadHandle>_>.
  super__Head_base<0UL,_cmUVStreamReadHandle_*,_false>._M_head_impl =
       (__uniq_ptr_data<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>,_true,_true>
       )(__uniq_ptr_data<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>,_true,_true>
         )this;
  uVar2 = cmUVProcessChain::OutputStream((cmUVProcessChain *)startRead.this);
  RunCommand::anon_class_24_3_169f6e42::operator()
            ((anon_class_24_3_169f6e42 *)&errorHandle,(uv_pipe_ptr *)&outputHandle,
             (int)&tempError + 0x10,(vector<char,_std::allocator<char>_> *)(ulong)uVar2,
             (bool *)local_158);
  uVar2 = cmUVProcessChain::ErrorStream
                    ((cmUVProcessChain *)
                     &timer.super_uv_handle_ptr_<uv_timer_s>.super_uv_handle_ptr_base_<uv_timer_s>.
                      handle.super___shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  RunCommand::anon_class_24_3_169f6e42::operator()
            ((anon_class_24_3_169f6e42 *)((long)&strdata.field_2 + 8),(uv_pipe_ptr *)&outputHandle,
             (int)local_1a0,(vector<char,_std::allocator<char>_> *)(ulong)uVar2,(bool *)local_188);
  while ((tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_ & 1) == 0) {
    puVar7 = cmUVProcessChain::GetLoop
                       ((cmUVProcessChain *)
                        &timer.super_uv_handle_ptr_<uv_timer_s>.
                         super_uv_handle_ptr_base_<uv_timer_s>.handle.
                         super___shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    uv_run(puVar7,UV_RUN_ONCE);
  }
  pPVar5 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                     (&this->Impl);
  if ((pPVar5->ExtraVerbose & 1U) != 0) {
    std::__cxx11::string::string((string *)local_1f0);
    std::__cxx11::string::string((string *)&local_210);
    cmProcessOutput::DecodeText
              ((cmProcessOutput *)((long)&startRead.processOutput + 7),&local_210,
               (string *)local_1f0,0);
    std::__cxx11::string::~string((string *)&local_210);
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      cmSystemTools::Stdout((string *)local_1f0);
    }
    std::__cxx11::string::~string((string *)local_1f0);
  }
  while( true ) {
    local_629 = 0;
    if ((tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_ & 1) == 0) {
      bVar1 = cmUVProcessChain::Finished
                        ((cmUVProcessChain *)
                         &timer.super_uv_handle_ptr_<uv_timer_s>.
                          super_uv_handle_ptr_base_<uv_timer_s>.handle.
                          super___shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      local_629 = bVar1 ^ 0xff;
    }
    if ((local_629 & 1) == 0) break;
    puVar7 = cmUVProcessChain::GetLoop
                       ((cmUVProcessChain *)
                        &timer.super_uv_handle_ptr_<uv_timer_s>.
                         super_uv_handle_ptr_base_<uv_timer_s>.handle.
                         super___shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    uv_run(puVar7,UV_RUN_ONCE);
  }
  bVar1 = std::vector<char,_std::allocator<char>_>::empty
                    ((vector<char,_std::allocator<char>_> *)local_158);
  if (!bVar1) {
    std::vector<char,_std::allocator<char>_>::vector
              (&local_228,(vector<char,_std::allocator<char>_> *)local_158);
    cmProcessOutput::DecodeText
              ((cmProcessOutput *)((long)&startRead.processOutput + 7),&local_228,
               (vector<char,_std::allocator<char>_> *)local_158,0);
    std::vector<char,_std::allocator<char>_>::~vector(&local_228);
    pcVar8 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)local_158);
    std::vector<char,_std::allocator<char>_>::size((vector<char,_std::allocator<char>_> *)local_158)
    ;
    std::__cxx11::string::append((char *)stdOut,(ulong)pcVar8);
  }
  bVar1 = std::vector<char,_std::allocator<char>_>::empty
                    ((vector<char,_std::allocator<char>_> *)local_188);
  if (!bVar1) {
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)local_240,
               (vector<char,_std::allocator<char>_> *)local_188);
    cmProcessOutput::DecodeText
              ((cmProcessOutput *)((long)&startRead.processOutput + 7),
               (vector<char,_std::allocator<char>_> *)local_240,
               (vector<char,_std::allocator<char>_> *)local_188,0);
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)local_240);
    pcVar8 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)local_188);
    std::vector<char,_std::allocator<char>_>::size((vector<char,_std::allocator<char>_> *)local_188)
    ;
    std::__cxx11::string::append((char *)stdErr,(ulong)pcVar8);
  }
  error_str._7_1_ = true;
  if ((tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_ & 1) == 0) {
    exception.second.field_2._8_8_ =
         cmUVProcessChain::GetStatus
                   ((cmUVProcessChain *)
                    &timer.super_uv_handle_ptr_<uv_timer_s>.super_uv_handle_ptr_base_<uv_timer_s>.
                     handle.super___shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount,0
                   );
    cmUVProcessChain::Status::GetException_abi_cxx11_
              ((pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_418,(Status *)exception.second.field_2._8_8_);
    if (local_418._0_4_ == None) {
      if (retVal == (int *)0x0) {
        error_str._7_1_ = *(long *)(exception.second.field_2._8_8_ + 8) == 0;
      }
      else {
        *retVal = (int)*(undefined8 *)(exception.second.field_2._8_8_ + 8);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_590);
      poVar9 = std::operator<<((ostream *)local_590,(string *)&exception);
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar8 = (char *)std::__cxx11::string::c_str();
      Log(this,7,
          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
          ,0xe25,pcVar8,false);
      std::__cxx11::string::~string(local_5b0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_590);
      std::__cxx11::string::append((string *)stdErr);
      error_str._7_1_ = false;
    }
    std::
    pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_418);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3c8);
    poVar9 = std::operator<<((ostream *)local_3c8,"Process terminated due to timeout\n");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    pcVar8 = (char *)std::__cxx11::string::c_str();
    Log(this,7,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
        ,0xe14,pcVar8,false);
    std::__cxx11::string::~string((string *)&status);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3c8);
    strlen("Process terminated due to timeout\n");
    std::__cxx11::string::append((char *)stdErr,0x1103889);
    error_str._7_1_ = false;
  }
  std::unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>::~unique_ptr
            ((unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_> *)
             ((long)&strdata.field_2 + 8));
  std::unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>::~unique_ptr
            (&errorHandle);
  ::cm::uv_pipe_ptr::~uv_pipe_ptr((uv_pipe_ptr *)local_1a0);
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)local_188);
  ::cm::uv_pipe_ptr::~uv_pipe_ptr
            ((uv_pipe_ptr *)
             &tempError.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)local_158);
  ::cm::uv_timer_ptr::~uv_timer_ptr((uv_timer_ptr *)local_138);
  cmUVProcessChain::~cmUVProcessChain
            ((cmUVProcessChain *)
             &timer.super_uv_handle_ptr_<uv_timer_s>.super_uv_handle_ptr_base_<uv_timer_s>.handle.
              super___shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  cmUVProcessChainBuilder::~cmUVProcessChainBuilder((cmUVProcessChainBuilder *)local_f8);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_58);
  return error_str._7_1_;
}

Assistant:

bool cmCTest::RunCommand(std::vector<std::string> const& args,
                         std::string* stdOut, std::string* stdErr, int* retVal,
                         const char* dir, cmDuration timeout,
                         Encoding encoding)
{
  std::vector<const char*> argv;
  argv.reserve(args.size() + 1);
  for (std::string const& a : args) {
    argv.push_back(a.c_str());
  }
  argv.push_back(nullptr);

  stdOut->clear();
  stdErr->clear();

  cmUVProcessChainBuilder builder;
  builder.AddCommand(args)
    .SetBuiltinStream(cmUVProcessChainBuilder::Stream_OUTPUT)
    .SetBuiltinStream(cmUVProcessChainBuilder::Stream_ERROR);
  if (dir) {
    builder.SetWorkingDirectory(dir);
  }
  auto chain = builder.Start();

  cm::uv_timer_ptr timer;
  bool timedOut = false;
  if (timeout.count()) {
    timer.init(chain.GetLoop(), &timedOut);
    timer.start(
      [](uv_timer_t* t) {
        auto* timedOutPtr = static_cast<bool*>(t->data);
        *timedOutPtr = true;
      },
      static_cast<uint64_t>(timeout.count() * 1000.0), 0);
  }

  std::vector<char> tempOutput;
  bool outFinished = false;
  cm::uv_pipe_ptr outStream;
  std::vector<char> tempError;
  bool errFinished = false;
  cm::uv_pipe_ptr errStream;
  cmProcessOutput processOutput(encoding);
  auto startRead = [this, &chain, &processOutput](
                     cm::uv_pipe_ptr& pipe, int stream,
                     std::vector<char>& temp,
                     bool& finished) -> std::unique_ptr<cmUVStreamReadHandle> {
    pipe.init(chain.GetLoop(), 0);
    uv_pipe_open(pipe, stream);
    return cmUVStreamRead(
      pipe,
      [this, &temp, &processOutput](std::vector<char> data) {
        cm::append(temp, data);
        if (this->Impl->ExtraVerbose) {
          std::string strdata;
          processOutput.DecodeText(data.data(), data.size(), strdata);
          cmSystemTools::Stdout(strdata);
        }
      },
      [&finished]() { finished = true; });
  };
  auto outputHandle =
    startRead(outStream, chain.OutputStream(), tempOutput, outFinished);
  auto errorHandle =
    startRead(errStream, chain.ErrorStream(), tempError, errFinished);
  while (!timedOut && !(outFinished && errFinished)) {
    uv_run(&chain.GetLoop(), UV_RUN_ONCE);
  }
  if (this->Impl->ExtraVerbose) {
    std::string strdata;
    processOutput.DecodeText(std::string(), strdata);
    if (!strdata.empty()) {
      cmSystemTools::Stdout(strdata);
    }
  }

  while (!timedOut && !chain.Finished()) {
    uv_run(&chain.GetLoop(), UV_RUN_ONCE);
  }
  if (!tempOutput.empty()) {
    processOutput.DecodeText(tempOutput, tempOutput);
    stdOut->append(tempOutput.data(), tempOutput.size());
  }
  if (!tempError.empty()) {
    processOutput.DecodeText(tempError, tempError);
    stdErr->append(tempError.data(), tempError.size());
  }

  bool result = true;
  if (timedOut) {
    const char* error_str = "Process terminated due to timeout\n";
    cmCTestLog(this, ERROR_MESSAGE, error_str << std::endl);
    stdErr->append(error_str, strlen(error_str));
    result = false;
  } else {
    auto const& status = chain.GetStatus(0);
    auto exception = status.GetException();
    switch (exception.first) {
      case cmUVProcessChain::ExceptionCode::None:
        if (retVal) {
          *retVal = static_cast<int>(status.ExitStatus);
        } else {
          if (status.ExitStatus != 0) {
            result = false;
          }
        }
        break;
      default: {
        cmCTestLog(this, ERROR_MESSAGE, exception.second << std::endl);
        stdErr->append(exception.second);
        result = false;
      } break;
    }
  }

  return result;
}